

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_tec(REF_GRID ref_grid,char *filename)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ncell;
  REF_GLOB *l2c;
  REF_GLOB nnode;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  file = (FILE *)filename;
  filename_local = (char *)ref_grid;
  uVar1 = ref_node_synchronize_globals((REF_NODE)ref_cell);
  if (uVar1 == 0) {
    ref_node = (REF_NODE)0x0;
    if (*(int *)(*(long *)filename_local + 4) == 0) {
      ref_node = (REF_NODE)fopen((char *)file,"w");
      if ((FILE *)ref_node == (FILE *)0x0) {
        printf("unable to open %s\n",file);
      }
      if (ref_node == (REF_NODE)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x443,"ref_gather_tec","unable to open file");
        return 2;
      }
      fprintf((FILE *)ref_node,"title=\"geometry\"\n");
      fprintf((FILE *)ref_node,"variables = \"x\" \"y\" \"z\"\n");
    }
    nnode = *(REF_GLOB *)(filename_local + 0x10);
    uVar1 = ref_grid_compact_cell_nodes
                      ((REF_GRID)filename_local,(REF_CELL)nnode,(REF_GLOB *)&l2c,
                       (REF_LONG *)&ref_private_macro_code_rss_1,(REF_GLOB **)&ncell);
    if (uVar1 == 0) {
      if ((0 < (long)l2c) && (0 < _ref_private_macro_code_rss_1)) {
        if (*(int *)(*(long *)filename_local + 4) == 0) {
          fprintf((FILE *)ref_node,
                  "zone t=\"edge\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",l2c,
                  _ref_private_macro_code_rss_1,"point","felineseg");
        }
        uVar1 = ref_gather_node_tec_part
                          ((REF_NODE)ref_cell,(REF_GLOB)l2c,(REF_GLOB *)ncell,0,(REF_DBL *)0x0,
                           (FILE *)ref_node);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x454,"ref_gather_tec",(ulong)uVar1,"nodes");
          return uVar1;
        }
        uVar1 = ref_gather_cell_tec((REF_NODE)ref_cell,(REF_CELL)nnode,_ref_private_macro_code_rss_1
                                    ,(REF_GLOB *)ncell,0,(FILE *)ref_node);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x456,"ref_gather_tec",(ulong)uVar1,"nodes");
          return uVar1;
        }
      }
      if (ncell != 0) {
        free((void *)ncell);
      }
      nnode = *(REF_GLOB *)(filename_local + 0x28);
      uVar1 = ref_grid_compact_cell_nodes
                        ((REF_GRID)filename_local,(REF_CELL)nnode,(REF_GLOB *)&l2c,
                         (REF_LONG *)&ref_private_macro_code_rss_1,(REF_GLOB **)&ncell);
      if (uVar1 == 0) {
        if ((0 < (long)l2c) && (0 < _ref_private_macro_code_rss_1)) {
          if (*(int *)(*(long *)filename_local + 4) == 0) {
            fprintf((FILE *)ref_node,
                    "zone t=\"face\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",l2c,
                    _ref_private_macro_code_rss_1,"point","fetriangle");
          }
          uVar1 = ref_gather_node_tec_part
                            ((REF_NODE)ref_cell,(REF_GLOB)l2c,(REF_GLOB *)ncell,0,(REF_DBL *)0x0,
                             (FILE *)ref_node);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x465,"ref_gather_tec",(ulong)uVar1,"nodes");
            return uVar1;
          }
          uVar1 = ref_gather_cell_tec((REF_NODE)ref_cell,(REF_CELL)nnode,
                                      _ref_private_macro_code_rss_1,(REF_GLOB *)ncell,0,
                                      (FILE *)ref_node);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x467,"ref_gather_tec",(ulong)uVar1,"nodes");
            return uVar1;
          }
        }
        if (ncell != 0) {
          free((void *)ncell);
        }
        nnode = *(REF_GLOB *)(filename_local + 0x50);
        uVar1 = ref_grid_compact_cell_nodes
                          ((REF_GRID)filename_local,(REF_CELL)nnode,(REF_GLOB *)&l2c,
                           (REF_LONG *)&ref_private_macro_code_rss_1,(REF_GLOB **)&ncell);
        if (uVar1 == 0) {
          if ((0 < (long)l2c) && (0 < _ref_private_macro_code_rss_1)) {
            if (*(int *)(*(long *)filename_local + 4) == 0) {
              fprintf((FILE *)ref_node,
                      "zone t=\"tet\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",l2c,
                      _ref_private_macro_code_rss_1,"point","fetetrahedron");
            }
            uVar1 = ref_gather_node_tec_part
                              ((REF_NODE)ref_cell,(REF_GLOB)l2c,(REF_GLOB *)ncell,0,(REF_DBL *)0x0,
                               (FILE *)ref_node);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x476,"ref_gather_tec",(ulong)uVar1,"nodes");
              return uVar1;
            }
            uVar1 = ref_gather_cell_tec((REF_NODE)ref_cell,(REF_CELL)nnode,
                                        _ref_private_macro_code_rss_1,(REF_GLOB *)ncell,0,
                                        (FILE *)ref_node);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x478,"ref_gather_tec",(ulong)uVar1,"nodes");
              return uVar1;
            }
          }
          if (ncell != 0) {
            free((void *)ncell);
          }
          if (*(int *)(*(long *)filename_local + 4) == 0) {
            fclose((FILE *)ref_node);
          }
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x46d,"ref_gather_tec",(ulong)uVar1,"l2c");
          ref_grid_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x45c,"ref_gather_tec",(ulong)uVar1,"l2c");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",1099
             ,"ref_gather_tec",(ulong)uVar1,"l2c");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x43d,
           "ref_gather_tec",(ulong)uVar1,"sync");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_tec(REF_GRID ref_grid,
                                         const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    fprintf(file, "title=\"geometry\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\"\n");
  }

  ref_cell = ref_grid_edg(ref_grid);
  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");
  if (nnode > 0 && ncell > 0) {
    if (ref_grid_once(ref_grid)) {
      fprintf(file,
              "zone t=\"edge\", nodes=" REF_GLOB_FMT
              ", elements=%ld, datapacking=%s, "
              "zonetype=%s\n",
              nnode, ncell, "point", "felineseg");
    }
    RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, 0, NULL, file), "nodes");
    RSS(ref_gather_cell_tec(ref_node, ref_cell, ncell, l2c, REF_FALSE, file),
        "nodes");
  }
  ref_free(l2c);

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");
  if (nnode > 0 && ncell > 0) {
    if (ref_grid_once(ref_grid)) {
      fprintf(file,
              "zone t=\"face\", nodes=" REF_GLOB_FMT
              ", elements=%ld, datapacking=%s, "
              "zonetype=%s\n",
              nnode, ncell, "point", "fetriangle");
    }
    RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, 0, NULL, file), "nodes");
    RSS(ref_gather_cell_tec(ref_node, ref_cell, ncell, l2c, REF_FALSE, file),
        "nodes");
  }
  ref_free(l2c);

  ref_cell = ref_grid_tet(ref_grid);
  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");
  if (nnode > 0 && ncell > 0) {
    if (ref_grid_once(ref_grid)) {
      fprintf(file,
              "zone t=\"tet\", nodes=" REF_GLOB_FMT
              ", elements=%ld, datapacking=%s, "
              "zonetype=%s\n",
              nnode, ncell, "point", "fetetrahedron");
    }
    RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, 0, NULL, file), "nodes");
    RSS(ref_gather_cell_tec(ref_node, ref_cell, ncell, l2c, REF_FALSE, file),
        "nodes");
  }
  ref_free(l2c);

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}